

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutMerge.c
# Opt level: O3

Cut_Cut_t * Cut_CutMergeTwo3(Cut_Man_t *p,Cut_Cut_t *pCut0,Cut_Cut_t *pCut1)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Cut_Cut_t *pCVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  Cut_Cut_t *pCVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  
  uVar11 = *(uint *)pCut0;
  uVar9 = uVar11 >> 0x1c;
  uVar5 = *(uint *)pCut1 >> 0x1c;
  if (uVar9 < uVar5) {
    __assert_fail("pCut0->nLeaves >= pCut1->nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutMerge.c"
                  ,0x11c,"Cut_Cut_t *Cut_CutMergeTwo3(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)");
  }
  pCVar4 = p->pReady;
  if (pCVar4 == (Cut_Cut_t *)0x0) {
    pCVar4 = Cut_CutAlloc(p);
    p->pReady = pCVar4;
    uVar11 = *(uint *)pCut0;
    uVar9 = uVar11 >> 0x1c;
    uVar5 = *(uint *)pCut1 >> 0x1c;
  }
  pCVar8 = pCVar4 + 1;
  uVar1 = p->pParams->nVarsMax;
  uVar7 = (ulong)uVar1;
  if (uVar9 == uVar1) {
    if (uVar5 == uVar1) {
      if (0xfffffff < uVar11) {
        uVar6 = 0;
        do {
          uVar5 = *(uint *)(&pCut0[1].field_0x0 + uVar6 * 4);
          *(uint *)((long)&pCVar8->field_0x0 + uVar6 * 4) = uVar5;
          if (uVar5 != *(uint *)(&pCut1[1].field_0x0 + uVar6 * 4)) {
            return (Cut_Cut_t *)0x0;
          }
          uVar6 = uVar6 + 1;
        } while (uVar7 != uVar6);
      }
    }
    else {
      uVar9 = 0;
      if (0xfffffff < uVar11) {
        uVar6 = 0;
        uVar9 = 0;
        do {
          uVar1 = *(uint *)(&pCut0[1].field_0x0 + uVar6 * 4);
          *(uint *)((long)&pCVar8->field_0x0 + uVar6 * 4) = uVar1;
          uVar10 = uVar5;
          if ((uVar9 != uVar5) &&
             (uVar10 = uVar9,
             (int)*(uint *)(&pCut1[1].field_0x0 + (long)(int)uVar9 * 4) <= (int)uVar1)) {
            if (uVar1 != *(uint *)(&pCut1[1].field_0x0 + (long)(int)uVar9 * 4)) {
              return (Cut_Cut_t *)0x0;
            }
            uVar10 = uVar9 + 1;
          }
          uVar9 = uVar10;
          uVar6 = uVar6 + 1;
        } while (uVar7 != uVar6);
      }
      if ((int)uVar9 < (int)uVar5) {
        return (Cut_Cut_t *)0x0;
      }
    }
    uVar6 = (ulong)(uVar11 & 0xf0000000);
  }
  else {
    if ((int)uVar1 < 1) {
      uVar10 = 0;
      uVar11 = 0;
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      uVar11 = 0;
      uVar10 = 0;
      do {
        if (uVar11 == uVar5) {
          if (uVar10 == uVar9) goto LAB_008e04a6;
          *(uint *)pCVar8 = *(uint *)(&pCut0[1].field_0x0 + (long)(int)uVar10 * 4);
          uVar11 = uVar5;
          uVar10 = uVar10 + 1;
        }
        else {
          lVar12 = (long)(int)uVar11;
          if (uVar10 == uVar9) {
            uVar11 = uVar11 + 1;
            *(uint *)pCVar8 = *(uint *)(&pCut1[1].field_0x0 + lVar12 * 4);
            uVar10 = uVar9;
          }
          else {
            uVar2 = *(uint *)(&pCut0[1].field_0x0 + (long)(int)uVar10 * 4);
            uVar3 = *(uint *)(&pCut1[1].field_0x0 + lVar12 * 4);
            if ((int)uVar2 < (int)uVar3) {
              uVar10 = uVar10 + 1;
              *(uint *)pCVar8 = uVar2;
            }
            else if ((int)uVar3 < (int)uVar2) {
              uVar11 = uVar11 + 1;
              *(uint *)pCVar8 = uVar3;
            }
            else {
              uVar10 = uVar10 + 1;
              *(uint *)pCVar8 = uVar2;
              uVar11 = uVar11 + 1;
            }
          }
        }
        uVar6 = uVar6 + 0x10000000;
        pCVar8 = (Cut_Cut_t *)&pCVar8->uSign;
      } while (uVar7 << 0x1c != uVar6);
      uVar6 = (ulong)(uVar1 << 0x1c);
    }
    if ((int)uVar10 < (int)uVar9) {
      return (Cut_Cut_t *)0x0;
    }
    if ((int)uVar11 < (int)uVar5) {
      return (Cut_Cut_t *)0x0;
    }
  }
LAB_008e04a6:
  *(uint *)pCVar4 = *(uint *)pCVar4 & 0xfffffff | (uint)uVar6;
  pCVar4 = p->pReady;
  p->pReady = (Cut_Cut_t *)0x0;
  return pCVar4;
}

Assistant:

Cut_Cut_t * Cut_CutMergeTwo3( Cut_Man_t * p, Cut_Cut_t * pCut0, Cut_Cut_t * pCut1 )
{ 
    Cut_Cut_t * pRes;
    int * pLeaves;
    int Limit, nLeaves0, nLeaves1;
    int i, k, c;

    assert( pCut0->nLeaves >= pCut1->nLeaves );

    // prepare the cut
    if ( p->pReady == NULL )
        p->pReady = Cut_CutAlloc( p );
    pLeaves = p->pReady->pLeaves;

    // consider two cuts
    Limit = p->pParams->nVarsMax;
    nLeaves0 = pCut0->nLeaves;
    nLeaves1 = pCut1->nLeaves;
    if ( nLeaves0 == Limit )
    { // the case when one of the cuts is the largest
        if ( nLeaves1 == Limit )
        { // the case when both cuts are the largest
            for ( i = 0; i < nLeaves0; i++ )
            {
                pLeaves[i] = pCut0->pLeaves[i];
                if ( pLeaves[i] != pCut1->pLeaves[i] )
                    return NULL;
            }
        }
        else
        {
            for ( i = k = 0; i < nLeaves0; i++ )
            {
                pLeaves[i] = pCut0->pLeaves[i];
                if ( k == (int)nLeaves1 )
                    continue;
                if ( pLeaves[i] < pCut1->pLeaves[k] )
                    continue;
                if ( pLeaves[i] == pCut1->pLeaves[k++] )
                    continue;
                return NULL;
            }
            if ( k < nLeaves1 )
                return NULL;
        }
        p->pReady->nLeaves = nLeaves0;
        pRes = p->pReady;  p->pReady = NULL;
        return pRes;
    }

    // compare two cuts with different numbers
    i = k = 0;
    for ( c = 0; c < Limit; c++ )
    {
        if ( k == nLeaves1 )
        {
            if ( i == nLeaves0 )
            {
                p->pReady->nLeaves = c;
                pRes = p->pReady;  p->pReady = NULL;
                return pRes;
            }
            pLeaves[c] = pCut0->pLeaves[i++];
            continue;
        }
        if ( i == nLeaves0 )
        {
            if ( k == nLeaves1 )
            {
                p->pReady->nLeaves = c;
                pRes = p->pReady;  p->pReady = NULL;
                return pRes;
            }
            pLeaves[c] = pCut1->pLeaves[k++];
            continue;
        }
        if ( pCut0->pLeaves[i] < pCut1->pLeaves[k] )
        {
            pLeaves[c] = pCut0->pLeaves[i++];
            continue;
        }
        if ( pCut0->pLeaves[i] > pCut1->pLeaves[k] )
        {
            pLeaves[c] = pCut1->pLeaves[k++];
            continue;
        }
        pLeaves[c] = pCut0->pLeaves[i++]; 
        k++;
    }
    if ( i < nLeaves0 || k < nLeaves1 )
        return NULL;
    p->pReady->nLeaves = c;
    pRes = p->pReady;  p->pReady = NULL;
    return pRes;
}